

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_2::AreLayoutCompatibleStructs
               (ValidationState_t *_,Instruction *type1,Instruction *type2)

{
  bool bVar1;
  Op OVar2;
  Instruction *type2_local;
  Instruction *type1_local;
  ValidationState_t *__local;
  
  OVar2 = val::Instruction::opcode((Instruction *)type1);
  if (OVar2 == OpTypeStruct) {
    OVar2 = val::Instruction::opcode((Instruction *)type2);
    if (OVar2 == OpTypeStruct) {
      bVar1 = HaveLayoutCompatibleMembers(_,type1,type2);
      if (bVar1) {
        __local._7_1_ = HaveSameLayoutDecorations(_,type1,type2);
      }
      else {
        __local._7_1_ = false;
      }
    }
    else {
      __local._7_1_ = false;
    }
  }
  else {
    __local._7_1_ = false;
  }
  return __local._7_1_;
}

Assistant:

bool AreLayoutCompatibleStructs(ValidationState_t& _, const Instruction* type1,
                                const Instruction* type2) {
  if (type1->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }
  if (type2->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  if (!HaveLayoutCompatibleMembers(_, type1, type2)) return false;

  return HaveSameLayoutDecorations(_, type1, type2);
}